

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O3

qpdf_oh qpdf_get_object_by_id(qpdf_data qpdf,int objid,int generation)

{
  qpdf_oh qVar1;
  QPDFObjectHandle local_20;
  
  QPDF::getObjectByID((QPDF *)&local_20,
                      (int)(qpdf->qpdf).super___shared_ptr<QPDF,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                      objid);
  qVar1 = new_object(qpdf,&local_20);
  if (local_20.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  return qVar1;
}

Assistant:

qpdf_oh
qpdf_get_object_by_id(qpdf_data qpdf, int objid, int generation)
{
    QTC::TC("qpdf", "qpdf-c called qpdf_get_object_by_id");
    return new_object(qpdf, qpdf->qpdf->getObjectByID(objid, generation));
}